

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O0

const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
 testing::internal::
 ArrayAwareFind<google::const_table_iterator<google::sparsetable<int,(unsigned_short)48,google::libc_allocator_with_realloc<int>>>,int>
           (const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
            begin,const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  end,int *elem)

{
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  cVar1;
  bool bVar2;
  reference lhs;
  size_type in_RCX;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *in_RDX;
  size_type in_RSI;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *in_RDI;
  const_iterator *in_R8;
  const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
  it;
  sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_> *local_10;
  size_type local_8;
  
  while (bVar2 = google::
                 const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                 ::operator!=((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                               *)in_RDX,in_R8), local_10 = in_RDX, local_8 = in_RCX, bVar2) {
    lhs = google::
          const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
          ::operator*((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                       *)0x9c858f);
    bVar2 = ArrayEq<int,int>(lhs,(int *)in_R8);
    local_10 = in_RDI;
    local_8 = in_RSI;
    if (bVar2) break;
    google::
    const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
    ::operator++((const_table_iterator<google::sparsetable<int,_(unsigned_short)48,_google::libc_allocator_with_realloc<int>_>_>
                  *)in_RDX);
  }
  cVar1.pos = local_8;
  cVar1.table = local_10;
  return cVar1;
}

Assistant:

Iter ArrayAwareFind(Iter begin, Iter end, const Element& elem) {
  for (Iter it = begin; it != end; ++it) {
    if (internal::ArrayEq(*it, elem)) return it;
  }
  return end;
}